

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToLiteralsAndBackupInst::Exec
          (SyncToLiteralsAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Type *addr;
  Type *this_00;
  ScannerInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  Recycler *this_01;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  CharCount CVar11;
  Char *pat;
  undefined1 local_80 [8];
  TrackAllocData data;
  type_info *local_48;
  
  uVar6 = (this->super_BackupMixin).backup.lower;
  CVar11 = *matchStart;
  if (uVar6 <= inputLength - CVar11) {
    if (*inputOffset < *nextSyncInputOffset) {
LAB_00ef6644:
      *instPointer = *instPointer + 0x15;
      return false;
    }
    if (*inputOffset - CVar11 < uVar6) {
      *inputOffset = CVar11 + uVar6;
    }
    puVar8 = (matcher->literalNextSyncInputOffsets).ptr;
    if (puVar8 == (uint *)0x0) {
      if (4 < (this->super_ScannersMixin).numLiterals) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x9e1,"(numLiterals <= MaxNumSyncLiterals)",
                           "numLiterals <= MaxNumSyncLiterals");
        if (!bVar3) goto LAB_00ef6659;
        *puVar7 = 0;
      }
      local_80 = (undefined1  [8])&unsigned_int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 4;
      data.count = (size_t)anon_var_dwarf_a8a6704;
      data.filename._0_4_ = 0x9e3;
      this_01 = Memory::Recycler::TrackAllocInfo(matcher->recycler,(TrackAllocData *)local_80);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00ef6659;
        *puVar7 = 0;
      }
      puVar8 = (uint *)Memory::Recycler::
                       AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_01,0x10);
      if (puVar8 == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00ef6659:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      addr = &matcher->literalNextSyncInputOffsets;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = puVar8;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      puVar8 = addr->ptr;
    }
    iVar5 = (this->super_ScannersMixin).numLiterals;
    if (firstIteration) {
      if (iVar5 < 1) goto LAB_00ef6342;
      uVar6 = *inputOffset;
      lVar10 = 0;
      do {
        puVar8[lVar10] = uVar6;
        lVar10 = lVar10 + 1;
        iVar5 = (this->super_ScannersMixin).numLiterals;
      } while (lVar10 < iVar5);
    }
    if (0 < iVar5) {
      lVar10 = 0;
      iVar5 = -1;
      local_48 = (type_info *)0x0;
      data._32_8_ = matchStart;
      do {
        uVar6 = puVar8[lVar10];
        if (puVar8[lVar10] < *inputOffset) {
          uVar6 = *inputOffset;
        }
        local_80._0_4_ = uVar6;
        pSVar1 = (this->super_ScannersMixin).infos[lVar10].ptr;
        this_00 = &(pSVar1->super_ScannerMixin).scanner;
        CVar11 = (pSVar1->super_ScannerMixin).super_LiteralMixin.length;
        pat = (((matcher->program).ptr)->rep).insts.litbuf.ptr +
              (pSVar1->super_ScannerMixin).super_LiteralMixin.offset;
        if (pSVar1->isEquivClass == true) {
          bVar3 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                            (this_00,input,inputLength,(CharCount *)local_80,pat,CVar11,
                             matcher->stats);
        }
        else {
          bVar3 = TextbookBoyerMoore<char16_t>::Match<1u,1u>
                            (this_00,input,inputLength,(CharCount *)local_80,pat,CVar11,
                             matcher->stats);
        }
        CVar11 = inputLength;
        if (bVar3 != false) {
          bVar3 = (uint)local_80._0_4_ < (uint)local_48;
          if (bVar3 || iVar5 < 0) {
            local_48 = (type_info *)local_80;
          }
          local_48 = (type_info *)((ulong)local_48 & 0xffffffff);
          CVar11 = local_80._0_4_;
          if (bVar3 || iVar5 < 0) {
            iVar5 = (int)lVar10;
          }
        }
        puVar8[lVar10] = CVar11;
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->super_ScannersMixin).numLiterals);
      matchStart = (CharCount *)data._32_8_;
      if (-1 < iVar5) {
        iVar5 = (int)local_48;
        *nextSyncInputOffset = iVar5 + 1;
        uVar6 = (this->super_BackupMixin).backup.upper;
        CVar11 = *(CharCount *)data._32_8_;
        if (uVar6 != 0xffffffff) {
          uVar9 = iVar5 - CVar11;
          if (uVar6 <= iVar5 - CVar11) {
            uVar9 = uVar6;
          }
          CVar11 = iVar5 - uVar9;
          *(CharCount *)data._32_8_ = CVar11;
        }
        *inputOffset = CVar11;
        goto LAB_00ef6644;
      }
    }
  }
LAB_00ef6342:
  *matchStart = inputLength;
  return true;
}

Assistant:

inline bool SyncToLiteralsAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        int besti = -1;
        CharCount bestMatchOffset = 0;

        if (matcher.literalNextSyncInputOffsets == nullptr)
        {
            Assert(numLiterals <= MaxNumSyncLiterals);
            matcher.literalNextSyncInputOffsets =
                RecyclerNewArrayLeaf(matcher.recycler, CharCount, ScannersMixin::MaxNumSyncLiterals);
        }
        CharCount* literalNextSyncInputOffsets = matcher.literalNextSyncInputOffsets;

        if (firstIteration)
        {
            for (int i = 0; i < numLiterals; i++)
            {
                literalNextSyncInputOffsets[i] = inputOffset;
            }
        }

        for (int i = 0; i < numLiterals; i++)
        {
            CharCount thisMatchOffset = literalNextSyncInputOffsets[i];
            if (inputOffset > thisMatchOffset)
            {
                thisMatchOffset = inputOffset;
            }

            if (infos[i]->isEquivClass
                ? (infos[i]->scanner.Match<CaseInsensitive::EquivClassSize>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    ))
                : (infos[i]->scanner.Match<1>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    )))
            {
                if (besti < 0 || thisMatchOffset < bestMatchOffset)
                {
                    besti = i;
                    bestMatchOffset = thisMatchOffset;
                }

                literalNextSyncInputOffsets[i] = thisMatchOffset;
            }
            else
            {
                literalNextSyncInputOffsets[i] = inputLength;
            }
        }

        if (besti < 0)
        {
            // No literals matched
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = bestMatchOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = bestMatchOffset - matchStart;
            matchStart = bestMatchOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }